

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O3

cl_uint __thiscall CLIntercept::getRefCount(CLIntercept *this,cl_accelerator_intel accelerator)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  cl_uint refCount;
  cl_uint local_54;
  undefined1 local_50 [32];
  
  p_Var5 = (this->m_AcceleratorInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 == (_Base_ptr)0x0) {
LAB_001450cf:
    p_Var5 = (_Base_ptr)0x0;
  }
  else {
    p_Var1 = &(this->m_AcceleratorInfoMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var1->_M_header;
    do {
      if (*(cl_accelerator_intel *)(p_Var5 + 1) >= accelerator) {
        p_Var2 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(cl_accelerator_intel *)(p_Var5 + 1) < accelerator];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 == p_Var1) ||
       (accelerator < *(cl_accelerator_intel *)(p_Var2 + 1))) goto LAB_001450cf;
    p_Var5 = p_Var2[1]._M_parent;
  }
  p_Var2 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = &p_Var1->_M_header;
  if (p_Var2 == (_Base_ptr)0x0) {
LAB_00145115:
    local_50._0_8_ = (key_type)0x0;
    pmVar3 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)local_50);
  }
  else {
    do {
      if (*(_Base_ptr *)(p_Var2 + 1) >= p_Var5) {
        p_Var4 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(_Base_ptr *)(p_Var2 + 1) < p_Var5];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 == p_Var1) || (p_Var5 < *(_Base_ptr *)(p_Var4 + 1)))
    goto LAB_00145115;
    pmVar3 = (mapped_type *)&p_Var4[1]._M_parent;
  }
  if (pmVar3->clGetAcceleratorInfoINTEL ==
      (_func_cl_int_cl_accelerator_intel_cl_accelerator_info_intel_size_t_void_ptr_size_t_ptr *)0x0)
  {
    local_50._0_8_ = local_50 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"clGetAcceleratorInfoINTEL","");
    getExtensionFunctionAddress(this,(cl_platform_id)p_Var5,(string *)local_50);
    if ((key_type)local_50._0_8_ != (key_type)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_);
    }
  }
  local_54 = 0;
  p_Var2 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  if (p_Var2 != (_Base_ptr)0x0) {
    do {
      if (*(_Base_ptr *)(p_Var2 + 1) >= p_Var5) {
        p_Var4 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(_Base_ptr *)(p_Var2 + 1) < p_Var5];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
       ((_Base_ptr)((_Rb_tree_header *)p_Var4)->_M_node_count <= p_Var5)) {
      pmVar3 = (mapped_type *)((long)p_Var4 + 0x28);
      goto LAB_001451c6;
    }
  }
  local_50._0_8_ = (key_type)0x0;
  pmVar3 = std::
           map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
           ::at(&this->m_DispatchX,(key_type *)local_50);
LAB_001451c6:
  if (pmVar3->clGetAcceleratorInfoINTEL ==
      (_func_cl_int_cl_accelerator_intel_cl_accelerator_info_intel_size_t_void_ptr_size_t_ptr *)0x0)
  {
    local_54 = 0;
  }
  else {
    (*pmVar3->clGetAcceleratorInfoINTEL)(accelerator,0x4091,4,&local_54,(size_t *)0x0);
  }
  return local_54;
}

Assistant:

inline cl_uint CLIntercept::getRefCount( cl_accelerator_intel accelerator )
{
    cl_platform_id  platform = this->getPlatform(accelerator);
    if( dispatchX(platform).clGetAcceleratorInfoINTEL == NULL )
    {
        getExtensionFunctionAddress(
            platform,
            "clGetAcceleratorInfoINTEL" );
    }

    cl_uint refCount = 0;
    const auto& dispatchX = this->dispatchX(platform);
    if( dispatchX.clGetAcceleratorInfoINTEL )
    {
        dispatchX.clGetAcceleratorInfoINTEL(
            accelerator,
            CL_ACCELERATOR_REFERENCE_COUNT_INTEL,
            sizeof(refCount),
            &refCount,
            NULL );
    }
    return refCount;
}